

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfoDebug.cpp
# Opt level: O0

HighsDebugStatus
debugInfo(HighsOptions *options,HighsLp *lp,HighsBasis *basis,HighsSolution *solution,
         HighsInfo *info,HighsModelStatus model_status)

{
  HighsDebugStatus HVar1;
  byte *in_RCX;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  bool have_basis;
  bool have_dual_solution;
  bool have_primal_solution;
  bool have_info;
  HighsDebugStatus call_status;
  HighsDebugStatus return_status;
  HighsInfo *in_stack_000000f8;
  HighsDebugStatus local_38;
  HighsDebugStatus local_4;
  
  if (*(int *)(in_RDI + 0x15c) < 1) {
    return kNotChecked;
  }
  local_38 = kOk;
  if (in_R9D < 7) {
LAB_004d3397:
    HVar1 = debugNoInfo(in_stack_000000f8);
    if (HVar1 != kOk) {
      local_38 = HVar1;
    }
    local_4 = local_38;
  }
  else {
    if (in_R9D - 7 < 10) {
      if ((*in_RCX & 1) == 0) {
        if (*(int *)(in_R8 + 0x2c) != 0) {
          highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                      "Have no primal solution but primal status = %d\n",
                      (ulong)*(uint *)(in_R8 + 0x2c));
          return kLogicalError;
        }
      }
      else {
        if (*(int *)(in_R8 + 0x58) < 0) {
          highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                      "Have primal solution but num_primal_infeasibilities = %d\n",
                      (ulong)*(uint *)(in_R8 + 0x58));
          return kLogicalError;
        }
        if (*(int *)(in_R8 + 0x58) == 0) {
          if (*(int *)(in_R8 + 0x2c) != 2) {
            highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                        "Have primal solution and no infeasibilities but primal status = %d\n",
                        (ulong)*(uint *)(in_R8 + 0x2c));
            return kLogicalError;
          }
        }
        else if (*(int *)(in_R8 + 0x2c) != 1) {
          highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                      "Have primal solution and infeasibilities but primal status = %d\n",
                      (ulong)*(uint *)(in_R8 + 0x2c));
          return kLogicalError;
        }
      }
      if ((in_RCX[1] & 1) == 0) {
        if (*(int *)(in_R8 + 0x30) != 0) {
          highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                      "Have no dual solution but dual status = %d\n",(ulong)*(uint *)(in_R8 + 0x30))
          ;
          return kLogicalError;
        }
      }
      else {
        if (*(int *)(in_R8 + 0x70) < 0) {
          highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                      "Have dual solution but num_dual_infeasibilities = %d\n",
                      (ulong)*(uint *)(in_R8 + 0x70));
          return kLogicalError;
        }
        if (*(int *)(in_R8 + 0x70) == 0) {
          if (*(int *)(in_R8 + 0x30) != 2) {
            highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                        "Have dual solution and no infeasibilities but dual status = %d\n",
                        (ulong)*(uint *)(in_R8 + 0x30));
            return kLogicalError;
          }
        }
        else if (*(int *)(in_R8 + 0x30) != 1) {
          highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                      "Have dual solution and infeasibilities but dual status = %d\n",
                      (ulong)*(uint *)(in_R8 + 0x30));
          return kLogicalError;
        }
      }
    }
    else if (in_R9D == 0x12) goto LAB_004d3397;
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsDebugStatus debugInfo(const HighsOptions& options, const HighsLp& lp,
                           const HighsBasis& basis,
                           const HighsSolution& solution, const HighsInfo& info,
                           const HighsModelStatus model_status) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  HighsDebugStatus call_status;

  const bool have_info = info.valid;
  const bool have_primal_solution = solution.value_valid;
  const bool have_dual_solution = solution.dual_valid;
  const bool have_basis = basis.valid;
  switch (model_status) {
    case HighsModelStatus::kNotset:
    case HighsModelStatus::kLoadError:
    case HighsModelStatus::kModelError:
    case HighsModelStatus::kPresolveError:
    case HighsModelStatus::kSolveError:
    case HighsModelStatus::kPostsolveError:
    case HighsModelStatus::kModelEmpty:
    case HighsModelStatus::kMemoryLimit:
      // Should have no info, so check this and return
      assert(!have_primal_solution);
      assert(!have_dual_solution);
      assert(!have_basis);
      call_status = debugNoInfo(info);
      if (call_status != HighsDebugStatus::kOk) return_status = call_status;
      return return_status;
    case HighsModelStatus::kOptimal:
    case HighsModelStatus::kInfeasible:
    case HighsModelStatus::kUnbounded:
    case HighsModelStatus::kObjectiveBound:
    case HighsModelStatus::kObjectiveTarget:
    case HighsModelStatus::kUnboundedOrInfeasible:
    case HighsModelStatus::kTimeLimit:
    case HighsModelStatus::kIterationLimit:
    case HighsModelStatus::kSolutionLimit:
    case HighsModelStatus::kUnknown:
      // Should have info
      assert(have_info == true);
      if (have_primal_solution) {
        if (info.num_primal_infeasibilities < 0) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Have primal solution but num_primal_infeasibilities = "
                      "%" HIGHSINT_FORMAT "\n",
                      info.num_primal_infeasibilities);
          return HighsDebugStatus::kLogicalError;
        } else if (info.num_primal_infeasibilities == 0) {
          if (info.primal_solution_status != kSolutionStatusFeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have primal solution and no infeasibilities but "
                        "primal status = %" HIGHSINT_FORMAT "\n",
                        info.primal_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        } else {
          if (info.primal_solution_status != kSolutionStatusInfeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have primal solution and infeasibilities but primal "
                        "status = %" HIGHSINT_FORMAT "\n",
                        info.primal_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        }
      } else {
        if (info.primal_solution_status != kSolutionStatusNone) {
          highsLogDev(
              options.log_options, HighsLogType::kError,
              "Have no primal solution but primal status = %" HIGHSINT_FORMAT
              "\n",
              info.primal_solution_status);
          return HighsDebugStatus::kLogicalError;
        }
      }
      if (have_dual_solution) {
        if (info.num_dual_infeasibilities < 0) {
          highsLogDev(options.log_options, HighsLogType::kError,
                      "Have dual solution but num_dual_infeasibilities = "
                      "%" HIGHSINT_FORMAT "\n",
                      info.num_dual_infeasibilities);
          return HighsDebugStatus::kLogicalError;
        } else if (info.num_dual_infeasibilities == 0) {
          if (info.dual_solution_status != kSolutionStatusFeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have dual solution and no infeasibilities but dual "
                        "status = %" HIGHSINT_FORMAT "\n",
                        info.dual_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        } else {
          if (info.dual_solution_status != kSolutionStatusInfeasible) {
            highsLogDev(options.log_options, HighsLogType::kError,
                        "Have dual solution and infeasibilities but dual "
                        "status = %" HIGHSINT_FORMAT "\n",
                        info.dual_solution_status);
            return HighsDebugStatus::kLogicalError;
          }
        }
      } else {
        if (info.dual_solution_status != kSolutionStatusNone) {
          highsLogDev(
              options.log_options, HighsLogType::kError,
              "Have no dual solution but dual status = %" HIGHSINT_FORMAT "\n",
              info.dual_solution_status);
          return HighsDebugStatus::kLogicalError;
        }
      }
      break;
    default:
      // All cases should have been considered so assert on reaching here
      assert(1 == 0);
  }

  return return_status;
}